

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

vector<RPCResult,_std::allocator<RPCResult>_> *
DecodeTxDoc(vector<RPCResult,_std::allocator<RPCResult>_> *__return_storage_ptr__,
           string *txid_field_doc)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffe5b8;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffe5bc;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffe5c8;
  allocator_type *in_stack_ffffffffffffe5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe600;
  undefined7 in_stack_ffffffffffffe608;
  undefined1 in_stack_ffffffffffffe60f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffe610;
  undefined7 in_stack_ffffffffffffe618;
  undefined1 in_stack_ffffffffffffe61f;
  undefined7 in_stack_ffffffffffffe620;
  undefined1 in_stack_ffffffffffffe627;
  string *in_stack_ffffffffffffe628;
  undefined4 in_stack_ffffffffffffe630;
  Type in_stack_ffffffffffffe634;
  undefined4 in_stack_ffffffffffffe638;
  Type in_stack_ffffffffffffe63c;
  RPCResult *in_stack_ffffffffffffe640;
  undefined1 *local_1910;
  undefined1 *local_18f8;
  undefined1 *local_18e0;
  undefined1 *local_18c8;
  undefined1 *local_18b0;
  undefined1 *local_1898;
  long *local_1880;
  string *txid_field_doc_local;
  allocator<char> local_14ca;
  allocator<char> local_14c9;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  allocator<char> local_14aa;
  allocator<char> local_14a9;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  allocator<char> local_1489 [31];
  allocator<char> local_146a;
  allocator<char> local_1469 [29];
  allocator<char> local_144c;
  allocator<char> local_144b [3];
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  allocator<char> local_142b;
  allocator<char> local_142a [2];
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  allocator<char> local_140a;
  allocator<char> local_1409 [30];
  allocator<char> local_13eb;
  allocator<char> local_13ea [2];
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  allocator<char> local_13ca;
  allocator<char> local_13c9;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  allocator<char> local_13aa;
  allocator<char> local_13a9 [31];
  allocator<char> local_138a;
  allocator<char> local_1389;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  allocator<char> local_136a;
  allocator<char> local_1369;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  allocator<char> local_134a;
  allocator<char> local_1349;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  allocator<char> local_132a;
  allocator<char> local_1329 [31];
  allocator<char> local_130a;
  allocator<char> local_1309 [31];
  allocator<char> local_12ea;
  allocator<char> local_12e9;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  allocator<char> local_12ca;
  allocator<char> local_12c9;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  allocator<char> local_12aa;
  allocator<char> local_12a9;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  allocator<char> local_128a;
  allocator<char> local_1289;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  allocator<char> local_126a;
  allocator<char> local_1269;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  allocator<char> local_124a;
  allocator<char> local_1249;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  allocator<char> local_122a;
  allocator<char> local_1229;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  allocator<char> local_1201 [193];
  undefined1 local_1140 [320];
  undefined8 local_1000;
  undefined1 local_fa8 [64];
  undefined1 local_f68 [136];
  undefined1 local_ee0 [192];
  undefined1 local_e20 [136];
  undefined1 local_d98 [192];
  undefined1 local_cd8 [272];
  undefined1 local_bc8 [256];
  undefined1 local_ac8 [816];
  undefined1 local_798 [64];
  undefined1 local_758 [136];
  undefined1 local_6d0 [512];
  long local_4d0 [153];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::__cxx11::string::string(in_stack_ffffffffffffe600,in_stack_ffffffffffffe5f8);
  local_1228 = 0;
  uStack_1220 = 0;
  local_1218 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  local_1248 = 0;
  uStack_1240 = 0;
  local_1238 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  local_1268 = 0;
  uStack_1260 = 0;
  local_1258 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  local_1288 = 0;
  uStack_1280 = 0;
  local_1278 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  local_12a8 = 0;
  uStack_12a0 = 0;
  local_1298 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  local_12c8 = 0;
  uStack_12c0 = 0;
  local_12b8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  local_12e8 = 0;
  uStack_12e0 = 0;
  local_12d8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  local_1348 = 0;
  uStack_1340 = 0;
  local_1338 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638),
             in_stack_ffffffffffffe634,in_stack_ffffffffffffe628,(bool)in_stack_ffffffffffffe627,
             (string *)CONCAT17(in_stack_ffffffffffffe61f,in_stack_ffffffffffffe618),
             in_stack_ffffffffffffe610,(bool)in_stack_ffffffffffffe60f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  local_1368 = 0;
  uStack_1360 = 0;
  local_1358 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638),
             in_stack_ffffffffffffe634,in_stack_ffffffffffffe628,(bool)in_stack_ffffffffffffe627,
             (string *)CONCAT17(in_stack_ffffffffffffe61f,in_stack_ffffffffffffe618),
             in_stack_ffffffffffffe610,(bool)in_stack_ffffffffffffe60f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  local_1388 = 0;
  uStack_1380 = 0;
  local_1378 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638),
             in_stack_ffffffffffffe634,in_stack_ffffffffffffe628,(bool)in_stack_ffffffffffffe627,
             (string *)CONCAT17(in_stack_ffffffffffffe61f,in_stack_ffffffffffffe618),
             in_stack_ffffffffffffe610,(bool)in_stack_ffffffffffffe60f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  local_13c8 = 0;
  uStack_13c0 = 0;
  local_13b8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  local_13e8 = 0;
  uStack_13e0 = 0;
  local_13d8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<RPCResult>::allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  __l._M_len._0_7_ = in_stack_ffffffffffffe608;
  __l._M_array = (iterator)in_stack_ffffffffffffe600;
  __l._M_len._7_1_ = in_stack_ffffffffffffe60f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5f8,__l,
             in_stack_ffffffffffffe5f0);
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638),
             in_stack_ffffffffffffe634,in_stack_ffffffffffffe628,(bool)in_stack_ffffffffffffe627,
             (string *)CONCAT17(in_stack_ffffffffffffe61f,in_stack_ffffffffffffe618),
             in_stack_ffffffffffffe610,(bool)in_stack_ffffffffffffe60f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  local_1428 = 0;
  uStack_1420 = 0;
  local_1418 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<RPCResult>::allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe608;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe600;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe60f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5f8,__l_00,
             in_stack_ffffffffffffe5f0);
  uVar1 = 0;
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe63c,in_stack_ffffffffffffe638),
             in_stack_ffffffffffffe634,in_stack_ffffffffffffe628,(bool)in_stack_ffffffffffffe627,
             (string *)CONCAT17(in_stack_ffffffffffffe61f,in_stack_ffffffffffffe618),
             in_stack_ffffffffffffe610,(bool)in_stack_ffffffffffffe60f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  local_1448 = 0;
  uStack_1440 = 0;
  local_1438 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<RPCResult>::allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  __l_01._M_len._0_7_ = in_stack_ffffffffffffe608;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe600;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffe60f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5f8,__l_01,
             in_stack_ffffffffffffe5f0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<RPCResult>::allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  __l_02._M_len._0_7_ = in_stack_ffffffffffffe608;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe600;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffe60f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5f8,__l_02,
             in_stack_ffffffffffffe5f0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
                 in_stack_ffffffffffffe600);
  local_14a8 = 0;
  uStack_14a0 = 0;
  local_1498 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  local_14c8 = 0;
  uStack_14c0 = 0;
  local_14b8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe60f,in_stack_ffffffffffffe608),
             (char *)in_stack_ffffffffffffe600,(allocator<char> *)in_stack_ffffffffffffe5f8);
  ScriptPubKeyDoc();
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<RPCResult>::allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  __l_03._M_len._0_7_ = in_stack_ffffffffffffe608;
  __l_03._M_array = (iterator)in_stack_ffffffffffffe600;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffe60f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5f8,__l_03,
             in_stack_ffffffffffffe5f0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<RPCResult>::allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  __l_04._M_len._0_7_ = in_stack_ffffffffffffe608;
  __l_04._M_array = (iterator)in_stack_ffffffffffffe600;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffe60f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5f8,__l_04,
             in_stack_ffffffffffffe5f0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe640,in_stack_ffffffffffffe63c,
             (string *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630),
             in_stack_ffffffffffffe628,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe627,in_stack_ffffffffffffe620),
             (bool)in_stack_ffffffffffffe61f);
  std::allocator<RPCResult>::allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  __l_05._M_len._0_7_ = in_stack_ffffffffffffe608;
  __l_05._M_array = (iterator)in_stack_ffffffffffffe600;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffe60f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe5f8,__l_05,
             in_stack_ffffffffffffe5f0);
  std::allocator<RPCResult>::~allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  local_1880 = &local_8;
  do {
    local_1880 = local_1880 + -0x11;
    RPCResult::~RPCResult((RPCResult *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  } while (local_1880 != local_4d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::allocator<RPCResult>::~allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  local_1898 = local_ee0;
  do {
    local_1898 = local_1898 + -0x88;
    RPCResult::~RPCResult((RPCResult *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  } while (local_1898 != local_f68);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::allocator<RPCResult>::~allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  local_18b0 = local_fa8;
  do {
    local_18b0 = local_18b0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  } while (local_18b0 != local_1140);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_14ca);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_14c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_14aa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_14a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(local_1489);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_146a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(local_1469);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_144c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(local_144b);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::allocator<RPCResult>::~allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  local_18c8 = local_6d0;
  do {
    local_18c8 = local_18c8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  } while (local_18c8 != local_758);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::allocator<RPCResult>::~allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  local_18e0 = local_798;
  do {
    local_18e0 = local_18e0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  } while (local_18e0 != local_ac8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_142b);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(local_142a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::allocator<RPCResult>::~allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  local_18f8 = local_d98;
  do {
    local_18f8 = local_18f8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  } while (local_18f8 != local_e20);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_140a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(local_1409);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_13eb);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(local_13ea);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::allocator<RPCResult>::~allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  local_1910 = local_bc8;
  do {
    local_1910 = local_1910 + -0x88;
    RPCResult::~RPCResult((RPCResult *)CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  } while (local_1910 != local_cd8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_13ca);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_13c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_13aa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(local_13a9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_138a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_1389);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_136a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_1369);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_134a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_1349);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_132a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(local_1329);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_130a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(local_1309);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_12ea);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_12e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_12ca);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_12c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_12aa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_12a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_128a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_1289);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_126a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_1269);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_124a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_1249);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_122a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(&local_1229);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_ffffffffffffe5c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5bc,uVar1));
  std::allocator<char>::~allocator(local_1201);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCResult> DecodeTxDoc(const std::string& txid_field_doc)
{
    return {
        {RPCResult::Type::STR_HEX, "txid", txid_field_doc},
        {RPCResult::Type::STR_HEX, "hash", "The transaction hash (differs from txid for witness transactions)"},
        {RPCResult::Type::NUM, "size", "The serialized transaction size"},
        {RPCResult::Type::NUM, "vsize", "The virtual transaction size (differs from size for witness transactions)"},
        {RPCResult::Type::NUM, "weight", "The transaction's weight (between vsize*4-3 and vsize*4)"},
        {RPCResult::Type::NUM, "version", "The version"},
        {RPCResult::Type::NUM_TIME, "locktime", "The lock time"},
        {RPCResult::Type::ARR, "vin", "",
        {
            {RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR_HEX, "coinbase", /*optional=*/true, "The coinbase value (only if coinbase transaction)"},
                {RPCResult::Type::STR_HEX, "txid", /*optional=*/true, "The transaction id (if not coinbase transaction)"},
                {RPCResult::Type::NUM, "vout", /*optional=*/true, "The output number (if not coinbase transaction)"},
                {RPCResult::Type::OBJ, "scriptSig", /*optional=*/true, "The script (if not coinbase transaction)",
                {
                    {RPCResult::Type::STR, "asm", "Disassembly of the signature script"},
                    {RPCResult::Type::STR_HEX, "hex", "The raw signature script bytes, hex-encoded"},
                }},
                {RPCResult::Type::ARR, "txinwitness", /*optional=*/true, "",
                {
                    {RPCResult::Type::STR_HEX, "hex", "hex-encoded witness data (if any)"},
                }},
                {RPCResult::Type::NUM, "sequence", "The script sequence number"},
            }},
        }},
        {RPCResult::Type::ARR, "vout", "",
        {
            {RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR_AMOUNT, "value", "The value in " + CURRENCY_UNIT},
                {RPCResult::Type::NUM, "n", "index"},
                {RPCResult::Type::OBJ, "scriptPubKey", "", ScriptPubKeyDoc()},
            }},
        }},
    };
}